

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_file_server.cpp
# Opt level: O0

bool __thiscall
cppcms::impl::file_server::is_in_root
          (file_server *this,string *input_path,string *root,string *real)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string normal;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  file_server *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48 [71];
  byte local_1;
  
  __lhs = &local_68;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70);
  std::operator+(__lhs,in_RDI);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff68,local_48);
  bVar1 = canonical(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = is_file_prefix(in_stack_ffffffffffffff68,
                           (string *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    if (bVar1) {
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
  std::__cxx11::string::~string(local_48);
  return (bool)(local_1 & 1);
}

Assistant:

bool file_server::is_in_root(std::string const &input_path,std::string const &root,std::string &real)
{
	std::string normal=root + "/" + input_path;
	if(!canonical(normal,real))
		return false;
	if(!is_file_prefix(root,real))
		return false;
	return true;
}